

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles2::Functional::eval_distance_vec2(ShaderEvalContext *c)

{
  float *pfVar1;
  float fVar2;
  undefined1 local_20 [8];
  undefined1 local_18 [16];
  ShaderEvalContext *c_local;
  
  local_18._8_8_ = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_18,(int)c + 0x30,3);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_20,(int)local_18._8_8_ + 0x40,1);
  fVar2 = tcu::distance<float,2>((Vector<float,_2> *)local_18,(Vector<float,_2> *)local_20);
  pfVar1 = tcu::Vector<float,_4>::x((Vec4 *)(local_18._8_8_ + 0x1f0));
  *pfVar1 = fVar2;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }